

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall vera::Mesh::invertWindingOrder(Mesh *this)

{
  ulong *puVar1;
  pointer puVar2;
  long lVar3;
  ulong uVar4;
  
  if (this->m_drawMode == TRIANGLES) {
    puVar2 = (this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
    if (lVar3 != 0) {
      uVar4 = 0;
      do {
        puVar1 = (ulong *)(puVar2 + uVar4 + 1);
        *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
        uVar4 = uVar4 + 3;
      } while (uVar4 < (ulong)(lVar3 >> 2));
    }
  }
  return;
}

Assistant:

void Mesh::invertWindingOrder() {
    if ( getDrawMode() == TRIANGLES) {
        int tmp;
        for (size_t i = 0; i < m_indices.size(); i += 3) {
            tmp = m_indices[i+1];
            m_indices[i+1] = m_indices[i+2];
            m_indices[i+2] = tmp;
        }
    }
}